

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Suitable __thiscall
vkb::PhysicalDeviceSelector::is_device_suitable(PhysicalDeviceSelector *this,PhysicalDevice *pd)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  VkResult VVar7;
  VkResult VVar8;
  long lVar9;
  size_type sVar10;
  size_type sVar11;
  VulkanFunctions *pVVar12;
  uint local_a0;
  uint32_t i;
  bool required_features_supported;
  VkResult present_modes_ret;
  undefined1 local_80 [4];
  VkResult formats_ret;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> formats;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required_extensions_supported;
  Suitable SStack_24;
  bool present_queue;
  bool separate_transfer;
  bool separate_compute;
  bool dedicated_transfer;
  bool dedicated_compute;
  Suitable suitable;
  PhysicalDevice *pd_local;
  PhysicalDeviceSelector *this_local;
  
  SStack_24 = yes;
  lVar9 = std::__cxx11::string::size();
  if ((lVar9 != 0) &&
     (bVar1 = std::operator!=(&(this->criteria).name,(pd->properties).deviceName), bVar1)) {
    return no;
  }
  if ((pd->properties).apiVersion < (this->criteria).required_version) {
    return no;
  }
  uVar2 = detail::get_dedicated_queue_index(&pd->queue_families,2,4);
  uVar3 = detail::get_dedicated_queue_index(&pd->queue_families,4,2);
  uVar4 = detail::get_separate_queue_index(&pd->queue_families,2,4);
  uVar5 = detail::get_separate_queue_index(&pd->queue_families,4,2);
  uVar6 = detail::get_present_queue_index
                    (pd->physical_device,(this->instance_info).surface,&pd->queue_families);
  required_extensions_supported.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = uVar6 != 0xffffffff;
  if ((((this->criteria).require_dedicated_compute_queue & 1U) != 0) && (uVar2 == 0xffffffff)) {
    return no;
  }
  if ((((this->criteria).require_dedicated_transfer_queue & 1U) != 0) && (uVar3 == 0xffffffff)) {
    return no;
  }
  if ((((this->criteria).require_separate_compute_queue & 1U) != 0) && (uVar4 == 0xffffffff)) {
    return no;
  }
  if ((((this->criteria).require_separate_transfer_queue & 1U) != 0) && (uVar5 == 0xffffffff)) {
    return no;
  }
  if (((((this->criteria).require_present & 1U) != 0) &&
      (!(bool)required_extensions_supported.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_)) &&
     (((this->criteria).defer_surface_initialization & 1U) == 0)) {
    return no;
  }
  detail::check_device_extension_support
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48,&pd->available_extensions,&(this->criteria).required_extensions);
  sVar10 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48);
  sVar11 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&(this->criteria).required_extensions);
  if (sVar10 == sVar11) {
    if ((((this->criteria).defer_surface_initialization & 1U) == 0) &&
       (((this->criteria).require_present & 1U) != 0)) {
      std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
                ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                 &present_modes.
                  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_80);
      pVVar12 = detail::vulkan_functions();
      VVar7 = detail::
              get_vector<VkSurfaceFormatKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkSurfaceFormatKHR*),VkPhysicalDevice_T*const&,VkSurfaceKHR_T*const&>
                        ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                         &present_modes.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkSurfaceFormatKHR_ptr
                          **)&pVVar12->fp_vkGetPhysicalDeviceSurfaceFormatsKHR,&pd->physical_device,
                         &(this->instance_info).surface);
      pVVar12 = detail::vulkan_functions();
      VVar8 = detail::
              get_vector<VkPresentModeKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkPresentModeKHR*),VkPhysicalDevice_T*const&,VkSurfaceKHR_T*const&>
                        ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_80,
                         (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
                          **)&pVVar12->fp_vkGetPhysicalDeviceSurfacePresentModesKHR,
                         &pd->physical_device,&(this->instance_info).surface);
      if (((VVar7 != VK_SUCCESS) ||
          ((VVar8 != VK_SUCCESS ||
           (bVar1 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::empty
                              ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                               &present_modes.
                                super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)))) ||
         (bVar1 = std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::empty
                            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_80
                            ), bVar1)) {
        this_local._4_4_ = no;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~vector
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_80);
      std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~vector
                ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                 &present_modes.
                  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (bVar1) goto LAB_0010a5fd;
    }
    if ((((this->criteria).allow_any_type & 1U) == 0) &&
       ((pd->properties).deviceType != (this->criteria).preferred_type)) {
      SStack_24 = partial;
    }
    bVar1 = detail::supports_features
                      (&pd->features,&(this->criteria).required_features,
                       &pd->extended_features_chain,&(this->criteria).extended_features_chain);
    if (bVar1) {
      for (local_a0 = 0; local_a0 < (pd->memory_properties).memoryHeapCount; local_a0 = local_a0 + 1
          ) {
        if ((((pd->memory_properties).memoryHeaps[local_a0].flags & 1) != 0) &&
           ((pd->memory_properties).memoryHeaps[local_a0].size < (this->criteria).required_mem_size)
           ) {
          this_local._4_4_ = no;
          goto LAB_0010a5fd;
        }
      }
      this_local._4_4_ = SStack_24;
    }
    else {
      this_local._4_4_ = no;
    }
  }
  else {
    this_local._4_4_ = no;
  }
LAB_0010a5fd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return this_local._4_4_;
}

Assistant:

PhysicalDevice::Suitable PhysicalDeviceSelector::is_device_suitable(PhysicalDevice const& pd) const {
    PhysicalDevice::Suitable suitable = PhysicalDevice::Suitable::yes;

    if (criteria.name.size() > 0 && criteria.name != pd.properties.deviceName) return PhysicalDevice::Suitable::no;

    if (criteria.required_version > pd.properties.apiVersion) return PhysicalDevice::Suitable::no;

    bool dedicated_compute = detail::get_dedicated_queue_index(pd.queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT) !=
                             detail::QUEUE_INDEX_MAX_VALUE;
    bool dedicated_transfer = detail::get_dedicated_queue_index(pd.queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT) !=
                              detail::QUEUE_INDEX_MAX_VALUE;
    bool separate_compute = detail::get_separate_queue_index(pd.queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT) !=
                            detail::QUEUE_INDEX_MAX_VALUE;
    bool separate_transfer = detail::get_separate_queue_index(pd.queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT) !=
                             detail::QUEUE_INDEX_MAX_VALUE;

    bool present_queue = detail::get_present_queue_index(pd.physical_device, instance_info.surface, pd.queue_families) !=
                         detail::QUEUE_INDEX_MAX_VALUE;

    if (criteria.require_dedicated_compute_queue && !dedicated_compute) return PhysicalDevice::Suitable::no;
    if (criteria.require_dedicated_transfer_queue && !dedicated_transfer) return PhysicalDevice::Suitable::no;
    if (criteria.require_separate_compute_queue && !separate_compute) return PhysicalDevice::Suitable::no;
    if (criteria.require_separate_transfer_queue && !separate_transfer) return PhysicalDevice::Suitable::no;
    if (criteria.require_present && !present_queue && !criteria.defer_surface_initialization)
        return PhysicalDevice::Suitable::no;

    auto required_extensions_supported =
        detail::check_device_extension_support(pd.available_extensions, criteria.required_extensions);
    if (required_extensions_supported.size() != criteria.required_extensions.size())
        return PhysicalDevice::Suitable::no;

    if (!criteria.defer_surface_initialization && criteria.require_present) {
        std::vector<VkSurfaceFormatKHR> formats;
        std::vector<VkPresentModeKHR> present_modes;

        auto formats_ret = detail::get_vector<VkSurfaceFormatKHR>(formats,
            detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceFormatsKHR,
            pd.physical_device,
            instance_info.surface);
        auto present_modes_ret = detail::get_vector<VkPresentModeKHR>(present_modes,
            detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfacePresentModesKHR,
            pd.physical_device,
            instance_info.surface);

        if (formats_ret != VK_SUCCESS || present_modes_ret != VK_SUCCESS || formats.empty() || present_modes.empty()) {
            return PhysicalDevice::Suitable::no;
        }
    }

    if (!criteria.allow_any_type && pd.properties.deviceType != static_cast<VkPhysicalDeviceType>(criteria.preferred_type)) {
        suitable = PhysicalDevice::Suitable::partial;
    }

    bool required_features_supported = detail::supports_features(
        pd.features, criteria.required_features, pd.extended_features_chain, criteria.extended_features_chain);
    if (!required_features_supported) return PhysicalDevice::Suitable::no;

    for (uint32_t i = 0; i < pd.memory_properties.memoryHeapCount; i++) {
        if (pd.memory_properties.memoryHeaps[i].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) {
            if (pd.memory_properties.memoryHeaps[i].size < criteria.required_mem_size) {
                return PhysicalDevice::Suitable::no;
            }
        }
    }

    return suitable;
}